

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O1

void __thiscall
FastPForLib::CSVReader::CSVReader(CSVReader *this,istream *in,string *delimiter,char commentmarker)

{
  pointer pcVar1;
  
  this->_vptr_CSVReader = (_func_int **)&PTR__CSVReader_00109d80;
  (this->line)._M_dataplus._M_p = (pointer)&(this->line).field_2;
  (this->line)._M_string_length = 0;
  (this->line).field_2._M_local_buf[0] = '\0';
  (this->mDelimiter)._M_dataplus._M_p = (pointer)&(this->mDelimiter).field_2;
  pcVar1 = (delimiter->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mDelimiter,pcVar1,pcVar1 + delimiter->_M_string_length);
  (this->mDelimiterPlusSpace)._M_dataplus._M_p = (pointer)&(this->mDelimiterPlusSpace).field_2;
  pcVar1 = (delimiter->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mDelimiterPlusSpace,pcVar1,pcVar1 + delimiter->_M_string_length);
  this->mCommentMarker = commentmarker;
  this->mIn = in;
  (this->currentData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->currentData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->currentData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

CSVReader(std::istream *in, const std::string delimiter = ",",
            const char commentmarker = '#')
      : line(), mDelimiter(delimiter), mDelimiterPlusSpace(delimiter),
        mCommentMarker(commentmarker), mIn(in), currentData() {}